

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResultPoint.h
# Opt level: O2

bool ZXing::DataMatrix::IsValidPoint(ResultPoint *p,int imgWidth,int imgHeight)

{
  bool bVar1;
  float fVar2;
  
  fVar2 = (float)(p->super_PointF).x;
  bVar1 = false;
  if ((0.0 <= fVar2) && (bVar1 = false, fVar2 < (float)imgWidth)) {
    fVar2 = (float)(p->super_PointF).y;
    if (fVar2 <= 0.0) {
      return false;
    }
    bVar1 = fVar2 < (float)imgHeight;
  }
  return bVar1;
}

Assistant:

float x() const { return static_cast<float>(PointF::x); }